

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void vision_init(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0x15; local_c = local_c + 1) {
    cs_rows0[local_c] = could_see[0][local_c];
    cs_rows1[local_c] = (char *)((long)local_c * 0x50 + 0x417e20);
    viz_clear_rows[local_c] = viz_clear[local_c];
  }
  viz_array = cs_rows0;
  viz_rmin = cs_rmin0;
  viz_rmax = cs_rmax0;
  vision_full_recalc = '\0';
  memset(could_see,0,0xd20);
  return;
}

Assistant:

void vision_init(void)
{
    int i;

    /* Set up the pointers. */
    for (i = 0; i < ROWNO; i++) {
	cs_rows0[i] = could_see[0][i];
	cs_rows1[i] = could_see[1][i];
	viz_clear_rows[i] = viz_clear[i];
    }

    /* Start out with cs0 as our current array */
    viz_array = cs_rows0;
    viz_rmin  = cs_rmin0;
    viz_rmax  = cs_rmax0;

    vision_full_recalc = 0;
    memset(could_see, 0, sizeof(could_see));
}